

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool_extension.cpp
# Opt level: O2

bool __thiscall dlib::thread_pool_implementation::is_task_thread(thread_pool_implementation *this)

{
  bool bVar1;
  pthread_t id;
  auto_mutex M;
  auto_mutex local_28;
  
  local_28.m = &this->m;
  local_28.r = (rmutex *)0x0;
  local_28.rw = (read_write_mutex *)0x0;
  pthread_mutex_lock((pthread_mutex_t *)local_28.m);
  id = pthread_self();
  bVar1 = is_worker_thread(this,id);
  auto_mutex::~auto_mutex(&local_28);
  return bVar1;
}

Assistant:

bool thread_pool_implementation::
    is_task_thread (
    ) const
    {
        auto_mutex M(m);
        return is_worker_thread(get_thread_id());
    }